

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lvalue.cpp
# Opt level: O1

void __thiscall
iu_StringSplitLvalueCovertToInt_x_iutest_x_ByStlStr_Test<char>::Body
          (iu_StringSplitLvalueCovertToInt_x_iutest_x_ByStlStr_Test<char> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *in_R9;
  vector<int,_std::allocator<int>_> re2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  AssertionResult iutest_ar;
  allocator<char> local_281;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  AssertionHelper local_260;
  vector<int,_std::allocator<int>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  char local_1b8;
  undefined1 local_1b0 [128];
  ios_base local_130 [264];
  
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"123, 421, 113","");
  local_280 = &local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,", ","");
  sVar2 = local_278;
  paVar1 = &local_260.m_part_result.super_iuCodeMessage.m_message.field_2;
  if (local_280 == &local_270) {
    local_260.m_part_result.super_iuCodeMessage.m_message.field_2._8_4_ = local_270._8_4_;
    local_260.m_part_result.super_iuCodeMessage.m_message.field_2._12_4_ = local_270._12_4_;
    local_260.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_260.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_280;
  }
  local_260.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._4_4_ =
       local_270._M_allocated_capacity._4_4_;
  local_260.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       local_270._M_allocated_capacity._0_4_;
  local_260.m_part_result.super_iuCodeMessage.m_message._M_string_length = local_278;
  local_278 = 0;
  local_270._M_allocated_capacity._0_4_ = local_270._M_allocated_capacity._0_4_ & 0xffffff00;
  local_280 = &local_270;
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,
             local_260.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
             local_260.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p + sVar2);
  ::detail::
  operator|<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_lvalue_cpp:390:98),_false,_true,_nullptr>
            (&local_230,&local_218,
             (split_helper_conv_func<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_lvalue_cpp:390:98),_false,_false,_true>
              *)local_1b0);
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_260.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_260.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,
                    CONCAT44(local_270._M_allocated_capacity._4_4_,
                             local_270._M_allocated_capacity._0_4_) + 1);
  }
  if ((long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0xc) {
    local_1b8 = (int)*(long *)((long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start + 8) == 0x71 &&
                *(long *)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start == 0x1a50000007b;
  }
  else {
    local_1b8 = false;
  }
  local_1d0 = 0;
  local_1c8 = 0;
  local_1d8 = &local_1c8;
  if ((bool)local_1b8 == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)&local_1d8,
               (AssertionResult *)"std::equal(re1.begin(), re1.end(), re2.begin(), re2.end())",
               "false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,local_1f8._M_dataplus._M_p,&local_281);
    local_260.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
    ;
    local_260.m_part_result.super_iuCodeMessage.m_line = 0x189;
    local_260.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_260,(Fixed *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_260.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_260.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  if ((long *)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringSplitLvalue, chain_at_last_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}